

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx *dctx,int *nbSeqPtr,void *src,size_t srcSize)

{
  byte bVar1;
  byte bVar2;
  U16 UVar3;
  uint uVar4;
  byte *pbVar5;
  size_t sVar6;
  byte *pbVar7;
  size_t mlhSize;
  size_t ofhSize;
  size_t llhSize;
  symbolEncodingType_e MLtype;
  symbolEncodingType_e OFtype;
  symbolEncodingType_e LLtype;
  int nbSeq;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  size_t srcSize_local;
  void *src_local;
  int *nbSeqPtr_local;
  ZSTD_DCtx *dctx_local;
  
  pbVar5 = (byte *)((long)src + srcSize);
  if (srcSize == 0) {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
  }
  else {
    pbVar7 = (byte *)((long)src + 1);
    OFtype = (symbolEncodingType_e)*src;
    if (OFtype == set_basic) {
      *nbSeqPtr = 0;
      if (srcSize == 1) {
        dctx_local = (ZSTD_DCtx *)0x1;
      }
      else {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
      }
    }
    else {
      _LLtype = pbVar7;
      if (0x7f < OFtype) {
        if (OFtype == 0xff) {
          if (pbVar5 < (byte *)((long)src + 3)) {
            return 0xffffffffffffffb8;
          }
          UVar3 = MEM_readLE16(pbVar7);
          OFtype = UVar3 + 0x7f00;
          _LLtype = (byte *)((long)src + 3);
        }
        else {
          if (pbVar5 <= pbVar7) {
            return 0xffffffffffffffb8;
          }
          _LLtype = (byte *)((long)src + 2);
          OFtype = (OFtype - 0x80) * 0x100 + (uint)*pbVar7;
        }
      }
      *nbSeqPtr = OFtype;
      if (pbVar5 < _LLtype + 4) {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
      }
      else {
        bVar1 = *_LLtype;
        bVar2 = *_LLtype;
        pbVar7 = _LLtype + 1;
        sVar6 = ZSTD_buildSeqTable((dctx->entropy).LLTable,&dctx->LLTptr,(int)(uint)*_LLtype >> 6,
                                   0x23,9,pbVar7,(long)pbVar5 - (long)pbVar7,LL_base,LL_bits,
                                   LL_defaultDTable,dctx->fseEntropy,dctx->ddictIsCold,OFtype);
        uVar4 = ERR_isError(sVar6);
        if (uVar4 == 0) {
          pbVar7 = pbVar7 + sVar6;
          sVar6 = ZSTD_buildSeqTable((dctx->entropy).OFTable,&dctx->OFTptr,
                                     (int)(uint)bVar1 >> 4 & set_repeat,0x1f,8,pbVar7,
                                     (long)pbVar5 - (long)pbVar7,OF_base,OF_bits,OF_defaultDTable,
                                     dctx->fseEntropy,dctx->ddictIsCold,OFtype);
          uVar4 = ERR_isError(sVar6);
          if (uVar4 == 0) {
            pbVar7 = pbVar7 + sVar6;
            sVar6 = ZSTD_buildSeqTable((dctx->entropy).MLTable,&dctx->MLTptr,
                                       (int)(uint)bVar2 >> 2 & set_repeat,0x34,9,pbVar7,
                                       (long)pbVar5 - (long)pbVar7,ML_base,ML_bits,ML_defaultDTable,
                                       dctx->fseEntropy,dctx->ddictIsCold,OFtype);
            uVar4 = ERR_isError(sVar6);
            if (uVar4 == 0) {
              dctx_local = (ZSTD_DCtx *)(pbVar7 + (sVar6 - (long)src));
            }
            else {
              dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
            }
          }
          else {
            dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
          }
        }
        else {
          dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
        }
      }
    }
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx* dctx, int* nbSeqPtr,
                             const void* src, size_t srcSize)
{
    const BYTE* const istart = (const BYTE* const)src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip = istart;
    int nbSeq;
    DEBUGLOG(5, "ZSTD_decodeSeqHeaders");

    /* check */
    if (srcSize < MIN_SEQUENCES_SIZE) return ERROR(srcSize_wrong);

    /* SeqHead */
    nbSeq = *ip++;
    if (!nbSeq) {
        *nbSeqPtr=0;
        if (srcSize != 1) return ERROR(srcSize_wrong);
        return 1;
    }
    if (nbSeq > 0x7F) {
        if (nbSeq == 0xFF) {
            if (ip+2 > iend) return ERROR(srcSize_wrong);
            nbSeq = MEM_readLE16(ip) + LONGNBSEQ, ip+=2;
        } else {
            if (ip >= iend) return ERROR(srcSize_wrong);
            nbSeq = ((nbSeq-0x80)<<8) + *ip++;
        }
    }
    *nbSeqPtr = nbSeq;

    /* FSE table descriptors */
    if (ip+4 > iend) return ERROR(srcSize_wrong); /* minimum possible size */
    {   symbolEncodingType_e const LLtype = (symbolEncodingType_e)(*ip >> 6);
        symbolEncodingType_e const OFtype = (symbolEncodingType_e)((*ip >> 4) & 3);
        symbolEncodingType_e const MLtype = (symbolEncodingType_e)((*ip >> 2) & 3);
        ip++;

        /* Build DTables */
        {   size_t const llhSize = ZSTD_buildSeqTable(dctx->entropy.LLTable, &dctx->LLTptr,
                                                      LLtype, MaxLL, LLFSELog,
                                                      ip, iend-ip,
                                                      LL_base, LL_bits,
                                                      LL_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq);
            if (ZSTD_isError(llhSize)) return ERROR(corruption_detected);
            ip += llhSize;
        }

        {   size_t const ofhSize = ZSTD_buildSeqTable(dctx->entropy.OFTable, &dctx->OFTptr,
                                                      OFtype, MaxOff, OffFSELog,
                                                      ip, iend-ip,
                                                      OF_base, OF_bits,
                                                      OF_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq);
            if (ZSTD_isError(ofhSize)) return ERROR(corruption_detected);
            ip += ofhSize;
        }

        {   size_t const mlhSize = ZSTD_buildSeqTable(dctx->entropy.MLTable, &dctx->MLTptr,
                                                      MLtype, MaxML, MLFSELog,
                                                      ip, iend-ip,
                                                      ML_base, ML_bits,
                                                      ML_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq);
            if (ZSTD_isError(mlhSize)) return ERROR(corruption_detected);
            ip += mlhSize;
        }
    }

    return ip-istart;
}